

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O1

int amqp_basic_publish(amqp_connection_state_t state,amqp_channel_t channel,amqp_bytes_t exchange,
                      amqp_bytes_t routing_key,amqp_boolean_t mandatory,amqp_boolean_t immediate,
                      amqp_basic_properties_t *properties,amqp_bytes_t body)

{
  int iVar1;
  int iVar2;
  amqp_time_t aVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  amqp_frame_t f;
  amqp_basic_properties_t default_properties;
  undefined2 local_158 [4];
  size_t local_150;
  void *local_148;
  size_t local_140;
  void *local_138;
  amqp_boolean_t local_130;
  amqp_boolean_t local_12c;
  amqp_frame_t local_128;
  amqp_basic_properties_t local_f8;
  
  local_138 = routing_key.bytes;
  local_140 = routing_key.len;
  local_148 = exchange.bytes;
  local_150 = exchange.len;
  iVar1 = state->frame_max;
  local_130 = mandatory;
  local_12c = immediate;
  local_158[0] = 0;
  iVar2 = amqp_time_has_past((amqp_time_t)(state->next_recv_heartbeat).time_point_ns);
  if (iVar2 == -0xe) {
    return -0xe;
  }
  if (iVar2 == -0xd) {
    iVar2 = amqp_try_recv(state);
    if (iVar2 == -0xd) {
      return -0xf;
    }
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  aVar3 = amqp_time_infinite();
  iVar2 = amqp_send_method_inner(state,channel,0x3c0028,local_158,1,aVar3);
  if (-1 < iVar2) {
    if (properties == (amqp_basic_properties_t *)0x0) {
      properties = &local_f8;
      memset(properties,0,200);
    }
    local_128.frame_type = '\x02';
    local_128.payload.properties.class_id = 0x3c;
    local_128.payload.properties.body_size = body.len;
    local_128.channel = channel;
    local_128.payload.properties.decoded = properties;
    aVar3 = amqp_time_infinite();
    iVar2 = amqp_send_frame_inner(state,&local_128,(uint)(body.len != 0),aVar3);
    if (-1 < iVar2) {
      uVar5 = (long)iVar1 - 8;
      uVar6 = 0;
      do {
        uVar4 = body.len - uVar6;
        if (body.len < uVar6 || uVar4 == 0) {
          return 0;
        }
        local_128.frame_type = '\x03';
        local_128.payload.method.decoded = (void *)((long)body.bytes + uVar6);
        local_128.payload.body_fragment.len = uVar4;
        if (uVar5 <= uVar4) {
          local_128.payload.body_fragment.len = uVar5;
        }
        uVar6 = uVar6 + local_128.payload.body_fragment.len;
        local_128.channel = channel;
        aVar3 = amqp_time_infinite();
        iVar2 = amqp_send_frame_inner(state,&local_128,(uint)(uVar5 <= uVar4),aVar3);
      } while (-1 < iVar2);
    }
  }
  return iVar2;
}

Assistant:

int amqp_basic_publish(amqp_connection_state_t state, amqp_channel_t channel,
                       amqp_bytes_t exchange, amqp_bytes_t routing_key,
                       amqp_boolean_t mandatory, amqp_boolean_t immediate,
                       amqp_basic_properties_t const *properties,
                       amqp_bytes_t body) {
  amqp_frame_t f;
  size_t body_offset;
  size_t usable_body_payload_size =
      state->frame_max - (HEADER_SIZE + FOOTER_SIZE);
  int res;
  int flagz;

  amqp_basic_publish_t m;
  amqp_basic_properties_t default_properties;

  m.exchange = exchange;
  m.routing_key = routing_key;
  m.mandatory = mandatory;
  m.immediate = immediate;
  m.ticket = 0;

  /* TODO(alanxz): this heartbeat check is happening in the wrong place, it
   * should really be done in amqp_try_send/writev */
  res = amqp_time_has_past(state->next_recv_heartbeat);
  if (AMQP_STATUS_TIMER_FAILURE == res) {
    return res;
  } else if (AMQP_STATUS_TIMEOUT == res) {
    res = amqp_try_recv(state);
    if (AMQP_STATUS_TIMEOUT == res) {
      return AMQP_STATUS_HEARTBEAT_TIMEOUT;
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }
  }

  res = amqp_send_method_inner(state, channel, AMQP_BASIC_PUBLISH_METHOD, &m,
                               AMQP_SF_MORE, amqp_time_infinite());
  if (res < 0) {
    return res;
  }

  if (properties == NULL) {
    memset(&default_properties, 0, sizeof(default_properties));
    properties = &default_properties;
  }

  f.frame_type = AMQP_FRAME_HEADER;
  f.channel = channel;
  f.payload.properties.class_id = AMQP_BASIC_CLASS;
  f.payload.properties.body_size = body.len;
  f.payload.properties.decoded = (void *)properties;

  if (body.len > 0) {
    flagz = AMQP_SF_MORE;
  } else {
    flagz = AMQP_SF_NONE;
  }
  res = amqp_send_frame_inner(state, &f, flagz, amqp_time_infinite());
  if (res < 0) {
    return res;
  }

  body_offset = 0;
  while (body_offset < body.len) {
    size_t remaining = body.len - body_offset;

    if (remaining == 0) {
      break;
    }

    f.frame_type = AMQP_FRAME_BODY;
    f.channel = channel;
    f.payload.body_fragment.bytes = amqp_offset(body.bytes, body_offset);
    if (remaining >= usable_body_payload_size) {
      f.payload.body_fragment.len = usable_body_payload_size;
      flagz = AMQP_SF_MORE;
    } else {
      f.payload.body_fragment.len = remaining;
      flagz = AMQP_SF_NONE;
    }

    body_offset += f.payload.body_fragment.len;
    res = amqp_send_frame_inner(state, &f, flagz, amqp_time_infinite());
    if (res < 0) {
      return res;
    }
  }

  return AMQP_STATUS_OK;
}